

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parquet_types.cpp
# Opt level: O2

void __thiscall
duckdb_parquet::SchemaElement::SchemaElement(SchemaElement *this,SchemaElement *other57)

{
  int32_t iVar1;
  type tVar2;
  int32_t iVar3;
  
  *(undefined ***)this = &PTR__SchemaElement_027dc030;
  (this->name)._M_dataplus._M_p = (pointer)&(this->name).field_2;
  (this->name)._M_string_length = 0;
  (this->name).field_2._M_local_buf[0] = '\0';
  LogicalType::LogicalType(&this->logicalType);
  this->__isset = (_SchemaElement__isset)((ushort)this->__isset & 0xfe00);
  iVar1 = other57->type_length;
  this->type = other57->type;
  this->type_length = iVar1;
  this->repetition_type = other57->repetition_type;
  std::__cxx11::string::_M_assign((string *)&this->name);
  tVar2 = other57->converted_type;
  iVar1 = other57->scale;
  iVar3 = other57->precision;
  this->num_children = other57->num_children;
  this->converted_type = tVar2;
  this->scale = iVar1;
  this->precision = iVar3;
  this->field_id = other57->field_id;
  LogicalType::operator=(&this->logicalType,&other57->logicalType);
  this->__isset = other57->__isset;
  return;
}

Assistant:

SchemaElement::SchemaElement(const SchemaElement& other57) {
  type = other57.type;
  type_length = other57.type_length;
  repetition_type = other57.repetition_type;
  name = other57.name;
  num_children = other57.num_children;
  converted_type = other57.converted_type;
  scale = other57.scale;
  precision = other57.precision;
  field_id = other57.field_id;
  logicalType = other57.logicalType;
  __isset = other57.__isset;
}